

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

cilkred_map *
repeated_merge_reducer_maps(__cilkrts_worker **w_ptr,cilkred_map *left_map,cilkred_map *right_map)

{
  do {
    left_map = merge_reducer_maps(w_ptr,left_map,right_map);
    right_map = (*w_ptr)->reducer_map;
    (*w_ptr)->reducer_map = (cilkred_map *)0x0;
  } while (right_map != (cilkred_map *)0x0);
  return left_map;
}

Assistant:

cilkred_map*
repeated_merge_reducer_maps(__cilkrts_worker **w_ptr,
			    cilkred_map      *left_map,
			    cilkred_map      *right_map)
{
    // Note: if right_map == NULL but w->reducer_map != NULL, then
    // this loop will reduce w->reducer_map into left_map.
    do {
	left_map = merge_reducer_maps(w_ptr, left_map, right_map);
	verify_current_wkr(*w_ptr);

	// Pull any newly created reducer map and loop around again.
	right_map = (*w_ptr)->reducer_map;
	(*w_ptr)->reducer_map = NULL;
    } while (right_map);
    return left_map;
}